

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O0

void __thiscall
dense_parameters::set_default<unsigned_int,set_rand_wrapper<dense_parameters>>
          (dense_parameters *this,uint *info)

{
  bool bVar1;
  uint32_t uVar2;
  float *index;
  int __c;
  uint32_t *in_RSI;
  dense_iterator<float> *rhs;
  dense_parameters *in_RDI;
  size_t i;
  iterator iter;
  uint32_t *stride;
  dense_iterator<float> local_48;
  long local_30;
  dense_iterator<float> local_28;
  uint32_t *local_10;
  
  local_10 = in_RSI;
  begin(in_RDI);
  local_30 = 0;
  while( true ) {
    end(in_RDI);
    rhs = &local_48;
    bVar1 = dense_iterator<float>::operator!=(&local_28,rhs);
    if (!bVar1) break;
    index = dense_iterator<float>::operator*(&local_28);
    stride = local_10;
    dense_iterator<float>::index(&local_28,(char *)rhs,__c);
    set_rand_wrapper<dense_parameters>::func((weight *)in_RDI,stride,(uint64_t)index);
    dense_iterator<float>::operator++(&local_28);
    uVar2 = dense_parameters::stride(in_RDI);
    local_30 = (ulong)uVar2 + local_30;
  }
  return;
}

Assistant:

void set_default(R& info)
  {
    iterator iter = begin();
    for (size_t i = 0; iter != end(); ++iter, i += stride()) T::func(*iter, info, iter.index());
  }